

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<bool>::InternalDeallocate
          (RepeatedField<bool> *this,Rep *rep,int size)

{
  int in_EDX;
  long *in_RSI;
  bool *limit;
  bool *e;
  long *local_20;
  
  if (in_RSI != (long *)0x0) {
    for (local_20 = in_RSI + 1; local_20 < (long *)((long)in_RSI + (long)in_EDX + 8);
        local_20 = (long *)((long)local_20 + 1)) {
    }
    if (*in_RSI == 0) {
      operator_delete(in_RSI);
    }
  }
  return;
}

Assistant:

void InternalDeallocate(Rep* rep, int size) {
    if (rep != NULL) {
      Element* e = &rep->elements[0];
      Element* limit = &rep->elements[size];
      for (; e < limit; e++) {
        e->~Element();
      }
      if (rep->arena == NULL) {
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
        const size_t bytes = size * sizeof(*e) + kRepHeaderSize;
        ::operator delete(static_cast<void*>(rep), bytes);
#else
        ::operator delete(static_cast<void*>(rep));
#endif
      }
    }
  }